

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O3

PFN_vkVoidFunction VK_LAYER_fossilize_GetInstanceProcAddr(VkInstance instance,char *pName)

{
  int iVar1;
  const_iterator cVar2;
  PFN_vkVoidFunction p_Var3;
  PFN_vkVoidFunction p_Var4;
  Instance *instance_00;
  long lVar5;
  key_type local_30;
  
  if (pName != (char *)0x0) {
    lVar5 = 0;
    do {
      iVar1 = strcmp(*(char **)((long)&Fossilize::interceptCoreInstanceCommand(char_const*)::
                                       coreInstanceCommands + lVar5),pName);
      if (iVar1 == 0) {
        if (*(PFN_vkVoidFunction *)((long)&PTR_CreateInstance_00175868 + lVar5) !=
            (PFN_vkVoidFunction)0x0) {
          return *(PFN_vkVoidFunction *)((long)&PTR_CreateInstance_00175868 + lVar5);
        }
        break;
      }
      lVar5 = lVar5 + 0x10;
    } while (lVar5 != 0x40);
    if (instance != (VkInstance)0x0) {
      iVar1 = pthread_mutex_lock((pthread_mutex_t *)Fossilize::globalLock);
      if (iVar1 != 0) {
        std::__throw_system_error(iVar1);
      }
      local_30 = *(key_type *)instance;
      cVar2 = std::
              _Hashtable<void_*,_std::pair<void_*const,_std::unique_ptr<Fossilize::Instance,_std::default_delete<Fossilize::Instance>_>_>,_std::allocator<std::pair<void_*const,_std::unique_ptr<Fossilize::Instance,_std::default_delete<Fossilize::Instance>_>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find((_Hashtable<void_*,_std::pair<void_*const,_std::unique_ptr<Fossilize::Instance,_std::default_delete<Fossilize::Instance>_>_>,_std::allocator<std::pair<void_*const,_std::unique_ptr<Fossilize::Instance,_std::default_delete<Fossilize::Instance>_>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      *)Fossilize::instanceData,&local_30);
      if (cVar2.
          super__Node_iterator_base<std::pair<void_*const,_std::unique_ptr<Fossilize::Instance,_std::default_delete<Fossilize::Instance>_>_>,_false>
          ._M_cur == (__node_type *)0x0) {
        instance_00 = (Instance *)0x0;
      }
      else {
        instance_00 = *(Instance **)
                       ((long)cVar2.
                              super__Node_iterator_base<std::pair<void_*const,_std::unique_ptr<Fossilize::Instance,_std::default_delete<Fossilize::Instance>_>_>,_false>
                              ._M_cur + 0x10);
      }
      pthread_mutex_unlock((pthread_mutex_t *)Fossilize::globalLock);
      p_Var3 = (*instance_00->gpa)(instance_00->instance,pName);
      if (p_Var3 != (PFN_vkVoidFunction)0x0) {
        lVar5 = 0;
        do {
          iVar1 = strcmp(*(char **)((long)&Fossilize::interceptInstanceCommand(char_const*)::
                                           instanceCommands + lVar5),pName);
          if (iVar1 == 0) {
            if (*(PFN_vkVoidFunction *)((long)&PTR_GetPhysicalDeviceProperties2_001758a8 + lVar5) !=
                (PFN_vkVoidFunction)0x0) {
              return *(PFN_vkVoidFunction *)
                      ((long)&PTR_GetPhysicalDeviceProperties2_001758a8 + lVar5);
            }
            break;
          }
          lVar5 = lVar5 + 0x10;
        } while (lVar5 != 0x20);
        p_Var4 = Fossilize::interceptDeviceCommand(instance_00,pName);
        if (p_Var4 != (PFN_vkVoidFunction)0x0) {
          return p_Var4;
        }
      }
      return p_Var3;
    }
  }
  return (PFN_vkVoidFunction)0x0;
}

Assistant:

VK_LAYER_EXPORT VKAPI_ATTR PFN_vkVoidFunction VKAPI_CALL VK_LAYER_fossilize_GetInstanceProcAddr(VkInstance instance, const char *pName)
{
	if (!pName)
		return nullptr;

	// We only wrap core Vulkan 1.0 instance commands, no need to check for availability of underlying implementation.
	auto proc = interceptCoreInstanceCommand(pName);
	if (proc)
		return proc;

	// For global instance functions, the assumption is that we cannot call down the chain.
	if (!instance)
		return nullptr;

	Instance *layer;
	{
		lock_guard<mutex> holder{globalLock};
		layer = getLayerData(getDispatchKey(instance), instanceData);
	}

	proc = layer->getProcAddr(pName);

	if (proc)
	{
		auto wrapped_proc = interceptInstanceCommand(pName);
		if (wrapped_proc)
			return wrapped_proc;
	}

	// If the underlying implementation returns nullptr, we also need to return nullptr.
	// This means we never expose wrappers which will end up dispatching into nullptr.
	if (proc)
	{
		auto wrapped_proc = interceptDeviceCommand(layer, pName);
		if (wrapped_proc)
			return wrapped_proc;
	}

	return proc;
}